

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
 __thiscall
duckdb::UncompressedStringStorage::StringInitSegment
          (UncompressedStringStorage *this,ColumnSegment *segment,block_id_t block_id,
          optional_ptr<duckdb::ColumnSegmentState,_true> segment_state)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  optional_ptr<duckdb::ColumnSegmentState,_true> oVar4;
  BufferManager *pBVar5;
  idx_t iVar6;
  element_type *__s;
  pointer pUVar7;
  templated_unique_single_t result;
  optional_ptr<duckdb::ColumnSegmentState,_true> local_38;
  BufferHandle local_30;
  
  local_38.ptr = segment_state.ptr;
  pBVar5 = BufferManager::GetBufferManager(segment->db);
  if (block_id == -1) {
    (*pBVar5->_vptr_BufferManager[7])(&local_30,pBVar5,&segment->block);
    iVar6 = ColumnSegment::SegmentSize(segment);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_30.node);
    pdVar2 = (local_30.node.ptr)->buffer;
    iVar3 = segment->offset;
    pdVar1 = pdVar2 + iVar3;
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    *(int *)(pdVar2 + iVar3 + 4) = (int)iVar6;
    BufferHandle::~BufferHandle(&local_30);
  }
  __s = (element_type *)operator_new(0xd0);
  switchD_0105b559::default(__s,0,0xd0);
  (__s->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__UncompressedStringSegmentState_02486660;
  (__s->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __s->block_manager = (BlockManager *)&__s->state;
  (__s->lock).super___mutex_base._M_mutex.__align = 1;
  *(undefined8 *)((long)&(__s->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__s->lock).super___mutex_base._M_mutex + 0x10) = 0;
  *(undefined4 *)((long)&(__s->lock).super___mutex_base._M_mutex + 0x18) = 0x3f800000;
  (__s->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  __s->state = BLOCK_UNLOADED;
  *(undefined3 *)&__s->field_0x41 = 0;
  __s->readers = (__atomic_base<int>)0x0;
  __s->block_id = 0;
  __s->tag = BASE_TABLE;
  __s->buffer_type = 0;
  *(undefined6 *)&__s->field_0x52 = 0;
  (__s->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
  super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
  (__s->eviction_seq_num).super___atomic_base<unsigned_long>._M_i = 0;
  (__s->lru_timestamp_msec).super___atomic_base<long>._M_i = 0;
  *(undefined8 *)&(__s->destroy_buffer_upon)._M_i = 0;
  (__s->memory_usage).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&__s->memory_charge = 0;
  (__s->memory_charge).size = 0;
  (__s->memory_charge).pool = (BufferPool *)0x0;
  __s->unswizzled = (undefined1 *)((long)&__s[1].lock.super___mutex_base._M_mutex + 8);
  (__s->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i = 1;
  __s[1].super_enable_shared_from_this<duckdb::BlockHandle>.__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  __s[1].super_enable_shared_from_this<duckdb::BlockHandle>.__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&__s[1].block_manager = 0x3f800000;
  __s[1].lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&__s[1].lock.super___mutex_base._M_mutex + 8) = 0;
  local_30.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __s;
  if (local_38.ptr != (ColumnSegmentState *)0x0) {
    optional_ptr<duckdb::ColumnSegmentState,_true>::CheckValid(&local_38);
    oVar4.ptr = local_38.ptr;
    pUVar7 = unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
             ::operator->((unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
                           *)&local_30);
    ::std::vector<long,_std::allocator<long>_>::_M_move_assign
              (&(pUVar7->on_disk_blocks).super_vector<long,_std::allocator<long>_>,
               &(oVar4.ptr)->blocks);
  }
  *(element_type **)this =
       local_30.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  return (unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
          )(unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
            )this;
}

Assistant:

unique_ptr<CompressedSegmentState>
UncompressedStringStorage::StringInitSegment(ColumnSegment &segment, block_id_t block_id,
                                             optional_ptr<ColumnSegmentState> segment_state) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	if (block_id == INVALID_BLOCK) {
		auto handle = buffer_manager.Pin(segment.block);
		StringDictionaryContainer dictionary;
		dictionary.size = 0;
		dictionary.end = UnsafeNumericCast<uint32_t>(segment.SegmentSize());
		SetDictionary(segment, handle, dictionary);
	}
	auto result = make_uniq<UncompressedStringSegmentState>();
	if (segment_state) {
		auto &serialized_state = segment_state->Cast<SerializedStringSegmentState>();
		result->on_disk_blocks = std::move(serialized_state.blocks);
	}
	return std::move(result);
}